

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  int iVar25;
  ulong uVar26;
  RayK<4> *pRVar27;
  long lVar28;
  byte bVar29;
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  Scene *pSVar32;
  ulong uVar33;
  ulong uVar34;
  int in_R11D;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  float fVar38;
  uint uVar39;
  float fVar43;
  float fVar45;
  vint4 bi;
  uint uVar44;
  uint uVar46;
  float fVar47;
  uint uVar48;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar49;
  float fVar59;
  float fVar65;
  vint4 ai;
  uint uVar50;
  uint uVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  uint uVar60;
  uint uVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  uint uVar66;
  uint uVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  uint uVar71;
  uint uVar72;
  float fVar73;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint uVar74;
  uint uVar77;
  uint uVar78;
  vint4 ai_1;
  uint uVar79;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar80;
  float fVar83;
  float fVar84;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar85;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar98;
  float fVar99;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar100;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar106;
  float fVar107;
  int iVar108;
  float fVar109;
  float fVar110;
  int iVar111;
  float fVar112;
  int iVar113;
  float fVar114;
  int iVar115;
  float fVar116;
  int iVar117;
  float fVar118;
  int iVar119;
  float fVar120;
  int iVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  NodeRef *local_b50;
  undefined1 local_b48 [16];
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  undefined8 local_b28;
  float fStack_b20;
  float fStack_b1c;
  undefined1 (*local_b10) [16];
  long local_b08;
  Scene *scene;
  uint *local_af8;
  ulong local_af0;
  RTCFilterFunctionNArguments args;
  float fStack_aa4;
  float fStack_a8c;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a30;
  float fStack_a2c;
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  float local_968 [4];
  float local_958 [4];
  float local_948 [4];
  float local_938 [4];
  undefined1 local_928 [16];
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined1 local_908 [8];
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined4 local_8e8;
  undefined4 uStack_8e4;
  undefined4 uStack_8e0;
  undefined4 uStack_8dc;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  uint local_8b8;
  uint uStack_8b4;
  uint uStack_8b0;
  uint uStack_8ac;
  uint local_8a8;
  uint uStack_8a4;
  uint uStack_8a0;
  uint uStack_89c;
  uint local_898;
  uint uStack_894;
  uint uStack_890;
  uint uStack_88c;
  undefined1 local_888 [16];
  undefined8 local_878;
  undefined8 uStack_870;
  int local_868;
  int iStack_864;
  int iStack_860;
  int iStack_85c;
  int local_858;
  int iStack_854;
  int iStack_850;
  int iStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  NodeRef stack [244];
  
  local_b50 = stack + 1;
  stack[0] = root;
  fVar80 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar83 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar94 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar84 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar123 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar126 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar37 = uVar33 ^ 0x10;
  iVar25 = (tray->tnear).field_0.i[k];
  iVar115 = (tray->tfar).field_0.i[k];
  local_878 = mm_lookupmask_ps._0_8_;
  uStack_870 = mm_lookupmask_ps._8_8_;
  local_888 = mm_lookupmask_ps._240_16_;
  pauVar30 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar24 = true;
  local_7f8 = fVar80;
  fStack_7f4 = fVar80;
  fStack_7f0 = fVar80;
  fStack_7ec = fVar80;
  local_808 = fVar83;
  fStack_804 = fVar83;
  fStack_800 = fVar83;
  fStack_7fc = fVar83;
  local_818 = fVar94;
  fStack_814 = fVar94;
  fStack_810 = fVar94;
  fStack_80c = fVar94;
  local_828 = fVar84;
  fStack_824 = fVar84;
  fStack_820 = fVar84;
  fStack_81c = fVar84;
  local_838 = fVar123;
  fStack_834 = fVar123;
  fStack_830 = fVar123;
  fStack_82c = fVar123;
  local_848 = fVar126;
  fStack_844 = fVar126;
  fStack_840 = fVar126;
  fStack_83c = fVar126;
  local_858 = iVar25;
  iStack_854 = iVar25;
  iStack_850 = iVar25;
  iStack_84c = iVar25;
  local_868 = iVar115;
  iStack_864 = iVar115;
  iStack_860 = iVar115;
  iStack_85c = iVar115;
  fVar95 = fVar83;
  fVar127 = fVar83;
  fVar54 = fVar83;
  fVar107 = fVar84;
  fVar53 = fVar84;
  fVar134 = fVar84;
  iVar108 = iVar25;
  iVar111 = iVar25;
  iVar113 = iVar25;
  iVar117 = iVar115;
  iVar119 = iVar115;
  iVar121 = iVar115;
  fVar124 = fVar80;
  fVar130 = fVar80;
  fVar98 = fVar80;
  fVar131 = fVar94;
  fVar64 = fVar94;
  fVar110 = fVar94;
  fVar63 = fVar123;
  fVar136 = fVar123;
  fVar125 = fVar123;
  fVar132 = fVar126;
  fVar99 = fVar126;
  fVar69 = fVar126;
  local_b10 = pauVar30;
  local_af0 = uVar33;
  do {
    uVar35 = local_b50[-1].ptr;
    local_b50 = local_b50 + -1;
    while ((uVar35 & 8) == 0) {
      pfVar5 = (float *)(uVar35 + 0x20 + uVar33);
      fVar38 = (*pfVar5 - fVar80) * fVar84;
      fVar43 = (pfVar5[1] - fVar124) * fVar107;
      fVar45 = (pfVar5[2] - fVar130) * fVar53;
      fVar47 = (pfVar5[3] - fVar98) * fVar134;
      pfVar5 = (float *)(uVar35 + 0x20 + uVar31);
      fVar49 = (*pfVar5 - fVar83) * fVar123;
      fVar59 = (pfVar5[1] - fVar95) * fVar63;
      fVar65 = (pfVar5[2] - fVar127) * fVar136;
      fVar70 = (pfVar5[3] - fVar54) * fVar125;
      uVar50 = (uint)((int)fVar49 < (int)fVar38) * (int)fVar38 |
               (uint)((int)fVar49 >= (int)fVar38) * (int)fVar49;
      uVar60 = (uint)((int)fVar59 < (int)fVar43) * (int)fVar43 |
               (uint)((int)fVar59 >= (int)fVar43) * (int)fVar59;
      uVar66 = (uint)((int)fVar65 < (int)fVar45) * (int)fVar45 |
               (uint)((int)fVar65 >= (int)fVar45) * (int)fVar65;
      uVar71 = (uint)((int)fVar70 < (int)fVar47) * (int)fVar47 |
               (uint)((int)fVar70 >= (int)fVar47) * (int)fVar70;
      pfVar5 = (float *)(uVar35 + 0x20 + uVar36);
      fVar38 = (*pfVar5 - fVar94) * fVar126;
      fVar43 = (pfVar5[1] - fVar131) * fVar132;
      fVar45 = (pfVar5[2] - fVar64) * fVar99;
      fVar47 = (pfVar5[3] - fVar110) * fVar69;
      uVar39 = (uint)((int)fVar38 < iVar25) * iVar25 | (uint)((int)fVar38 >= iVar25) * (int)fVar38;
      uVar44 = (uint)((int)fVar43 < iVar108) * iVar108 |
               (uint)((int)fVar43 >= iVar108) * (int)fVar43;
      uVar46 = (uint)((int)fVar45 < iVar111) * iVar111 |
               (uint)((int)fVar45 >= iVar111) * (int)fVar45;
      uVar48 = (uint)((int)fVar47 < iVar113) * iVar113 |
               (uint)((int)fVar47 >= iVar113) * (int)fVar47;
      pfVar5 = (float *)(uVar35 + 0x20 + uVar37);
      fVar38 = (*pfVar5 - fVar80) * fVar84;
      fVar43 = (pfVar5[1] - fVar124) * fVar107;
      fVar45 = (pfVar5[2] - fVar130) * fVar53;
      fVar47 = (pfVar5[3] - fVar98) * fVar134;
      pfVar5 = (float *)(uVar35 + 0x20 + (uVar31 ^ 0x10));
      fVar49 = (*pfVar5 - fVar83) * fVar123;
      fVar59 = (pfVar5[1] - fVar95) * fVar63;
      fVar65 = (pfVar5[2] - fVar127) * fVar136;
      fVar70 = (pfVar5[3] - fVar54) * fVar125;
      uVar74 = (uint)((int)fVar38 < (int)fVar49) * (int)fVar38 |
               (uint)((int)fVar38 >= (int)fVar49) * (int)fVar49;
      uVar77 = (uint)((int)fVar43 < (int)fVar59) * (int)fVar43 |
               (uint)((int)fVar43 >= (int)fVar59) * (int)fVar59;
      uVar78 = (uint)((int)fVar45 < (int)fVar65) * (int)fVar45 |
               (uint)((int)fVar45 >= (int)fVar65) * (int)fVar65;
      uVar79 = (uint)((int)fVar47 < (int)fVar70) * (int)fVar47 |
               (uint)((int)fVar47 >= (int)fVar70) * (int)fVar70;
      pfVar5 = (float *)(uVar35 + 0x20 + (uVar36 ^ 0x10));
      fVar38 = (*pfVar5 - fVar94) * fVar126;
      fVar43 = (pfVar5[1] - fVar131) * fVar132;
      fVar45 = (pfVar5[2] - fVar64) * fVar99;
      fVar47 = (pfVar5[3] - fVar110) * fVar69;
      uVar51 = (uint)(iVar115 < (int)fVar38) * iVar115 |
               (uint)(iVar115 >= (int)fVar38) * (int)fVar38;
      uVar61 = (uint)(iVar117 < (int)fVar43) * iVar117 |
               (uint)(iVar117 >= (int)fVar43) * (int)fVar43;
      uVar67 = (uint)(iVar119 < (int)fVar45) * iVar119 |
               (uint)(iVar119 >= (int)fVar45) * (int)fVar45;
      uVar72 = (uint)(iVar121 < (int)fVar47) * iVar121 |
               (uint)(iVar121 >= (int)fVar47) * (int)fVar47;
      auVar102._0_4_ =
           -(uint)((int)(((int)uVar74 < (int)uVar51) * uVar74 |
                        ((int)uVar74 >= (int)uVar51) * uVar51) <
                  (int)(((int)uVar39 < (int)uVar50) * uVar50 | ((int)uVar39 >= (int)uVar50) * uVar39
                       ));
      auVar102._4_4_ =
           -(uint)((int)(((int)uVar77 < (int)uVar61) * uVar77 |
                        ((int)uVar77 >= (int)uVar61) * uVar61) <
                  (int)(((int)uVar44 < (int)uVar60) * uVar60 | ((int)uVar44 >= (int)uVar60) * uVar44
                       ));
      auVar102._8_4_ =
           -(uint)((int)(((int)uVar78 < (int)uVar67) * uVar78 |
                        ((int)uVar78 >= (int)uVar67) * uVar67) <
                  (int)(((int)uVar46 < (int)uVar66) * uVar66 | ((int)uVar46 >= (int)uVar66) * uVar46
                       ));
      auVar102._12_4_ =
           -(uint)((int)(((int)uVar79 < (int)uVar72) * uVar79 |
                        ((int)uVar79 >= (int)uVar72) * uVar72) <
                  (int)(((int)uVar48 < (int)uVar71) * uVar71 | ((int)uVar48 >= (int)uVar71) * uVar48
                       ));
      uVar39 = movmskps((int)pauVar30,auVar102);
      pauVar30 = (undefined1 (*) [16])(ulong)uVar39;
      if (uVar39 == 0xf) goto joined_r0x002706e8;
      bVar29 = (byte)uVar39 ^ 0xf;
      pauVar30 = (undefined1 (*) [16])(ulong)bVar29;
      uVar26 = uVar35 & 0xfffffffffffffff0;
      lVar28 = 0;
      if (pauVar30 != (undefined1 (*) [16])0x0) {
        for (; (bVar29 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
        }
      }
      uVar35 = *(ulong *)(uVar26 + lVar28 * 8);
      uVar39 = bVar29 - 1 & (uint)bVar29;
      if (uVar39 != 0) {
        local_b50->ptr = uVar35;
        local_b50 = local_b50 + 1;
        lVar28 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
          }
        }
        uVar35 = *(ulong *)(uVar26 + lVar28 * 8);
        uVar39 = uVar39 - 1 & uVar39;
        pauVar30 = (undefined1 (*) [16])(ulong)uVar39;
        if (uVar39 != 0) {
          do {
            local_b50->ptr = uVar35;
            local_b50 = local_b50 + 1;
            lVar28 = 0;
            if (pauVar30 != (undefined1 (*) [16])0x0) {
              for (; ((ulong)pauVar30 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
              }
            }
            uVar35 = *(ulong *)(uVar26 + lVar28 * 8);
            pauVar30 = (undefined1 (*) [16])((ulong)pauVar30 & (ulong)(pauVar30[-1] + 0xf));
          } while (pauVar30 != (undefined1 (*) [16])0x0);
        }
      }
    }
    uVar26 = (ulong)((uint)uVar35 & 0xf);
    fVar83 = local_808;
    fVar95 = fStack_804;
    fVar127 = fStack_800;
    fVar54 = fStack_7fc;
    fVar84 = local_828;
    fVar107 = fStack_824;
    fVar53 = fStack_820;
    fVar134 = fStack_81c;
    iVar25 = local_858;
    iVar108 = iStack_854;
    iVar111 = iStack_850;
    iVar113 = iStack_84c;
    iVar115 = local_868;
    iVar117 = iStack_864;
    iVar119 = iStack_860;
    iVar121 = iStack_85c;
    fVar80 = local_7f8;
    fVar124 = fStack_7f4;
    fVar130 = fStack_7f0;
    fVar98 = fStack_7ec;
    fVar94 = local_818;
    fVar131 = fStack_814;
    fVar64 = fStack_810;
    fVar110 = fStack_80c;
    fVar123 = local_838;
    fVar63 = fStack_834;
    fVar136 = fStack_830;
    fVar125 = fStack_82c;
    fVar126 = local_848;
    fVar132 = fStack_844;
    fVar99 = fStack_840;
    fVar69 = fStack_83c;
    if (uVar26 != 8) {
      lVar28 = 0;
      do {
        pSVar32 = context->scene;
        puVar1 = (uint *)(lVar28 * 0x60 + (uVar35 & 0xfffffffffffffff0));
        local_af8 = puVar1 + 0x10;
        ppfVar7 = (pSVar32->vertices).items;
        pauVar30 = (undefined1 (*) [16])ppfVar7[*local_af8];
        pfVar5 = (float *)(*pauVar30 + (ulong)*puVar1 * 4);
        fVar123 = *pfVar5;
        fVar126 = pfVar5[1];
        fVar95 = pfVar5[2];
        pfVar5 = (float *)(*pauVar30 + (ulong)puVar1[4] * 4);
        fVar127 = *pfVar5;
        fVar54 = pfVar5[1];
        fVar107 = pfVar5[2];
        pfVar5 = (float *)(*pauVar30 + (ulong)puVar1[0xc] * 4);
        fVar53 = *pfVar5;
        local_b28._0_4_ = pfVar5[1];
        fVar134 = pfVar5[2];
        pfVar8 = ppfVar7[puVar1[0x11]];
        pfVar5 = pfVar8 + puVar1[1];
        fVar124 = *pfVar5;
        fVar130 = pfVar5[1];
        fVar98 = pfVar5[2];
        pfVar5 = pfVar8 + puVar1[5];
        fVar131 = *pfVar5;
        fVar64 = pfVar5[1];
        fVar110 = pfVar5[2];
        pfVar5 = pfVar8 + puVar1[0xd];
        fVar63 = *pfVar5;
        local_b28._4_4_ = pfVar5[1];
        fVar136 = pfVar5[2];
        pfVar9 = ppfVar7[puVar1[0x12]];
        pfVar5 = pfVar9 + puVar1[2];
        fVar125 = *pfVar5;
        fVar132 = pfVar5[1];
        fVar99 = pfVar5[2];
        pfVar5 = pfVar9 + puVar1[6];
        fVar69 = pfVar5[1];
        fVar38 = pfVar5[2];
        pfVar2 = pfVar9 + puVar1[0xe];
        fStack_b20 = pfVar2[1];
        fVar43 = pfVar2[2];
        pfVar10 = ppfVar7[puVar1[0x13]];
        pfVar3 = pfVar10 + puVar1[3];
        fVar45 = *pfVar3;
        fVar47 = pfVar3[1];
        fVar49 = pfVar3[2];
        pfVar3 = pfVar10 + puVar1[7];
        fVar59 = pfVar3[1];
        fVar65 = pfVar3[2];
        pfVar4 = pfVar10 + puVar1[0xf];
        fStack_b1c = pfVar4[1];
        fVar70 = pfVar4[2];
        fVar116 = fVar126 - fVar54;
        fVar118 = fVar130 - fVar64;
        fVar120 = fVar132 - fVar69;
        fVar122 = fVar47 - fVar59;
        fVar106 = fVar95 - fVar107;
        fVar109 = fVar98 - fVar110;
        fVar112 = fVar99 - fVar38;
        fVar114 = fVar49 - fVar65;
        fVar85 = fVar53 - fVar123;
        fVar88 = fVar63 - fVar124;
        fVar89 = *pfVar2 - fVar125;
        fVar90 = *pfVar4 - fVar45;
        fVar133 = (float)local_b28 - fVar126;
        fVar135 = local_b28._4_4_ - fVar130;
        fVar137 = fStack_b20 - fVar132;
        fVar138 = fStack_b1c - fVar47;
        fVar139 = fVar134 - fVar95;
        fVar140 = fVar136 - fVar98;
        fVar141 = fVar43 - fVar99;
        fVar142 = fVar70 - fVar49;
        local_958[0] = fVar106 * fVar133 - fVar116 * fVar139;
        local_958[1] = fVar109 * fVar135 - fVar118 * fVar140;
        local_958[2] = fVar112 * fVar137 - fVar120 * fVar141;
        local_958[3] = fVar114 * fVar138 - fVar122 * fVar142;
        fVar80 = *(float *)(ray + k * 4);
        fStack_a8c = *(float *)(ray + k * 4 + 0x10);
        fVar83 = *(float *)(ray + k * 4 + 0x40);
        fVar94 = *(float *)(ray + k * 4 + 0x50);
        auVar129._4_4_ = fVar94;
        auVar129._0_4_ = fVar94;
        auVar129._8_4_ = fVar94;
        auVar129._12_4_ = fVar94;
        fVar143 = fVar123 - fVar80;
        fVar145 = fVar124 - fVar80;
        fVar147 = fVar125 - fVar80;
        fVar149 = fVar45 - fVar80;
        fVar126 = fVar126 - fStack_a8c;
        fVar130 = fVar130 - fStack_a8c;
        fVar132 = fVar132 - fStack_a8c;
        fVar47 = fVar47 - fStack_a8c;
        fVar100 = fVar143 * fVar94 - fVar126 * fVar83;
        fVar103 = fVar145 * fVar94 - fVar130 * fVar83;
        fVar104 = fVar147 * fVar94 - fVar132 * fVar83;
        fVar105 = fVar149 * fVar94 - fVar47 * fVar83;
        fVar123 = fVar123 - fVar127;
        fVar124 = fVar124 - fVar131;
        fVar125 = fVar125 - *pfVar5;
        fVar45 = fVar45 - *pfVar3;
        local_948[0] = fVar123 * fVar139 - fVar106 * fVar85;
        local_948[1] = fVar124 * fVar140 - fVar109 * fVar88;
        local_948[2] = fVar125 * fVar141 - fVar112 * fVar89;
        local_948[3] = fVar45 * fVar142 - fVar114 * fVar90;
        fStack_aa4 = *(float *)(ray + k * 4 + 0x20);
        fVar84 = *(float *)(ray + k * 4 + 0x60);
        fVar95 = fVar95 - fStack_aa4;
        fVar98 = fVar98 - fStack_aa4;
        fVar99 = fVar99 - fStack_aa4;
        fVar49 = fVar49 - fStack_aa4;
        fVar52 = fVar95 * fVar83 - fVar143 * fVar84;
        fVar62 = fVar98 * fVar83 - fVar145 * fVar84;
        fVar68 = fVar99 * fVar83 - fVar147 * fVar84;
        fVar73 = fVar49 * fVar83 - fVar149 * fVar84;
        local_938[0] = fVar116 * fVar85 - fVar123 * fVar133;
        local_938[1] = fVar118 * fVar88 - fVar124 * fVar135;
        local_938[2] = fVar120 * fVar89 - fVar125 * fVar137;
        local_938[3] = fVar122 * fVar90 - fVar45 * fVar138;
        fVar144 = fVar126 * fVar84 - fVar95 * fVar94;
        fVar146 = fVar130 * fVar84 - fVar98 * fVar94;
        fVar148 = fVar132 * fVar84 - fVar99 * fVar94;
        fVar150 = fVar47 * fVar84 - fVar49 * fVar94;
        fVar91 = local_958[0] * fVar83 + local_948[0] * fVar94 + local_938[0] * fVar84;
        fVar92 = local_958[1] * fVar83 + local_948[1] * fVar94 + local_938[1] * fVar84;
        fVar93 = local_958[2] * fVar83 + local_948[2] * fVar94 + local_938[2] * fVar84;
        fVar94 = local_958[3] * fVar83 + local_948[3] * fVar94 + local_938[3] * fVar84;
        uVar39 = (uint)fVar91 & 0x80000000;
        uVar44 = (uint)fVar92 & 0x80000000;
        uVar46 = (uint)fVar93 & 0x80000000;
        uVar48 = (uint)fVar94 & 0x80000000;
        fVar85 = (float)((uint)(fVar85 * fVar144 + fVar133 * fVar52 + fVar139 * fVar100) ^ uVar39);
        fVar88 = (float)((uint)(fVar88 * fVar146 + fVar135 * fVar62 + fVar140 * fVar103) ^ uVar44);
        fVar89 = (float)((uint)(fVar89 * fVar148 + fVar137 * fVar68 + fVar141 * fVar104) ^ uVar46);
        fVar90 = (float)((uint)(fVar90 * fVar150 + fVar138 * fVar73 + fVar142 * fVar105) ^ uVar48);
        fVar100 = (float)((uint)(fVar144 * fVar123 + fVar52 * fVar116 + fVar100 * fVar106) ^ uVar39)
        ;
        fVar103 = (float)((uint)(fVar146 * fVar124 + fVar62 * fVar118 + fVar103 * fVar109) ^ uVar44)
        ;
        fVar68 = (float)((uint)(fVar148 * fVar125 + fVar68 * fVar120 + fVar104 * fVar112) ^ uVar46);
        fVar73 = (float)((uint)(fVar150 * fVar45 + fVar73 * fVar122 + fVar105 * fVar114) ^ uVar48);
        fVar125 = ABS(fVar91);
        fVar45 = ABS(fVar92);
        fVar52 = ABS(fVar93);
        fVar62 = ABS(fVar94);
        bVar22 = ((0.0 <= fVar85 && 0.0 <= fVar100) && fVar91 != 0.0) && fVar85 + fVar100 <= fVar125
        ;
        auVar87._0_4_ = -(uint)bVar22;
        bVar23 = ((0.0 <= fVar88 && 0.0 <= fVar103) && fVar92 != 0.0) && fVar88 + fVar103 <= fVar45;
        auVar87._4_4_ = -(uint)bVar23;
        bVar21 = ((0.0 <= fVar89 && 0.0 <= fVar68) && fVar93 != 0.0) && fVar89 + fVar68 <= fVar52;
        auVar87._8_4_ = -(uint)bVar21;
        bVar20 = ((0.0 <= fVar90 && 0.0 <= fVar73) && fVar94 != 0.0) && fVar90 + fVar73 <= fVar62;
        auVar87._12_4_ = -(uint)bVar20;
        local_b08 = (uVar35 & 0xfffffffffffffff0) + lVar28 * 0x60;
        in_R11D = movmskps(in_R11D,auVar87);
        pfVar5 = (float *)(*pauVar30 + (long)(ulong)puVar1[8] * 4);
        local_b38 = *pfVar5;
        fStack_b34 = pfVar5[1];
        fStack_b30 = pfVar5[2];
        fStack_b2c = pfVar5[3];
        pfVar8 = pfVar8 + puVar1[9];
        fVar94 = *pfVar8;
        fVar123 = pfVar8[1];
        fVar124 = pfVar8[2];
        local_7e8 = *(undefined8 *)(pfVar9 + puVar1[10]);
        uStack_7e0 = *(undefined8 *)(pfVar9 + puVar1[10] + 2);
        auVar102 = *(undefined1 (*) [16])(pfVar10 + puVar1[0xb]);
        pRVar27 = (RayK<4> *)(ulong)puVar1[8];
        scene = pSVar32;
        if (in_R11D != 0) {
          fVar91 = (float)(uVar39 ^ (uint)(fVar143 * local_958[0] +
                                          fVar126 * local_948[0] + fVar95 * local_938[0]));
          fVar130 = (float)(uVar44 ^ (uint)(fVar145 * local_958[1] +
                                           fVar130 * local_948[1] + fVar98 * local_938[1]));
          fVar98 = (float)(uVar46 ^ (uint)(fVar147 * local_958[2] +
                                          fVar132 * local_948[2] + fVar99 * local_938[2]));
          fVar132 = (float)(uVar48 ^ (uint)(fVar149 * local_958[3] +
                                           fVar47 * local_948[3] + fVar49 * local_938[3]));
          fVar126 = *(float *)(ray + k * 4 + 0x30);
          fVar95 = *(float *)(ray + k * 4 + 0x80);
          auVar55._0_4_ =
               -(uint)((fVar126 * fVar125 < fVar91 && fVar91 <= fVar95 * fVar125) && bVar22);
          auVar55._4_4_ =
               -(uint)((fVar126 * fVar45 < fVar130 && fVar130 <= fVar95 * fVar45) && bVar23);
          auVar55._8_4_ =
               -(uint)((fVar126 * fVar52 < fVar98 && fVar98 <= fVar95 * fVar52) && bVar21);
          auVar55._12_4_ =
               -(uint)((fVar126 * fVar62 < fVar132 && fVar132 <= fVar95 * fVar62) && bVar20);
          uVar39 = movmskps((int)ray,auVar55);
          pRVar27 = (RayK<4> *)(ulong)uVar39;
          pauVar30 = (undefined1 (*) [16])k;
          if (uVar39 != 0) {
            local_928._8_8_ = uStack_870;
            local_928._0_8_ = local_878;
            auVar19._4_4_ = fVar45;
            auVar19._0_4_ = fVar125;
            auVar19._8_4_ = fVar52;
            auVar19._12_4_ = fVar62;
            auVar129 = rcpps(auVar129,auVar19);
            fVar80 = auVar129._0_4_;
            fVar83 = auVar129._4_4_;
            fVar126 = auVar129._8_4_;
            fVar99 = auVar129._12_4_;
            fVar47 = (float)DAT_01f7ba10;
            fVar49 = DAT_01f7ba10._4_4_;
            fVar92 = DAT_01f7ba10._12_4_;
            fVar84 = DAT_01f7ba10._8_4_;
            fVar80 = (fVar47 - fVar125 * fVar80) * fVar80 + fVar80;
            fVar83 = (fVar49 - fVar45 * fVar83) * fVar83 + fVar83;
            fVar126 = (fVar84 - fVar52 * fVar126) * fVar126 + fVar126;
            fVar99 = (fVar92 - fVar62 * fVar99) * fVar99 + fVar99;
            local_968[0] = fVar91 * fVar80;
            local_968[1] = fVar130 * fVar83;
            local_968[2] = fVar98 * fVar126;
            local_968[3] = fVar132 * fVar99;
            auVar86._0_4_ = fVar85 * fVar80;
            auVar86._4_4_ = fVar88 * fVar83;
            auVar86._8_4_ = fVar89 * fVar126;
            auVar86._12_4_ = fVar90 * fVar99;
            auVar87 = minps(auVar86,_DAT_01f7ba10);
            auVar56._0_4_ = fVar80 * fVar100;
            auVar56._4_4_ = fVar83 * fVar103;
            auVar56._8_4_ = fVar126 * fVar68;
            auVar56._12_4_ = fVar99 * fVar73;
            auVar129 = minps(auVar56,_DAT_01f7ba10);
            auVar75._0_4_ = fVar47 - auVar87._0_4_;
            auVar75._4_4_ = fVar49 - auVar87._4_4_;
            auVar75._8_4_ = fVar84 - auVar87._8_4_;
            auVar75._12_4_ = fVar92 - auVar87._12_4_;
            auVar81._0_4_ = fVar47 - auVar129._0_4_;
            auVar81._4_4_ = fVar49 - auVar129._4_4_;
            auVar81._8_4_ = fVar84 - auVar129._8_4_;
            auVar81._12_4_ = fVar92 - auVar129._12_4_;
            local_988 = blendvps(auVar87,auVar75,local_928);
            local_978 = blendvps(auVar129,auVar81,local_928);
            uVar33 = (ulong)(byte)uVar39;
            do {
              uVar34 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                }
              }
              local_8b8 = local_af8[uVar34];
              pGVar11 = (pSVar32->geometries).items[local_8b8].ptr;
              if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0027153a;
                local_8e8 = *(undefined4 *)(local_988 + uVar34 * 4);
                fVar80 = local_968[uVar34 - 4];
                *(float *)(ray + k * 4 + 0x80) = local_968[uVar34];
                args.context = context->user;
                uVar6 = *(undefined4 *)(local_b08 + 0x50 + uVar34 * 4);
                local_8c8._4_4_ = uVar6;
                local_8c8._0_4_ = uVar6;
                local_8c8._8_4_ = uVar6;
                local_8c8._12_4_ = uVar6;
                local_8d8._4_4_ = fVar80;
                local_8d8._0_4_ = fVar80;
                local_8d8._8_4_ = fVar80;
                local_8d8._12_4_ = fVar80;
                local_918 = local_958[uVar34];
                fVar80 = local_948[uVar34];
                local_8f8 = local_938[uVar34];
                local_908._4_4_ = fVar80;
                local_908._0_4_ = fVar80;
                fStack_900 = fVar80;
                fStack_8fc = fVar80;
                fStack_914 = local_918;
                fStack_910 = local_918;
                fStack_90c = local_918;
                fStack_8f4 = local_8f8;
                fStack_8f0 = local_8f8;
                fStack_8ec = local_8f8;
                uStack_8e4 = local_8e8;
                uStack_8e0 = local_8e8;
                uStack_8dc = local_8e8;
                uStack_8b4 = local_8b8;
                uStack_8b0 = local_8b8;
                uStack_8ac = local_8b8;
                local_8a8 = (args.context)->instID[0];
                uStack_8a4 = local_8a8;
                uStack_8a0 = local_8a8;
                uStack_89c = local_8a8;
                local_898 = (args.context)->instPrimID[0];
                uStack_894 = local_898;
                uStack_890 = local_898;
                uStack_88c = local_898;
                local_b48 = *local_b10;
                args.valid = (int *)local_b48;
                args.geometryUserPtr = pGVar11->userPtr;
                args.hit = (RTCHitN *)&local_918;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar11->occlusionFilterN)(&args);
                }
                if (local_b48 == (undefined1  [16])0x0) {
                  auVar57._8_4_ = 0xffffffff;
                  auVar57._0_8_ = 0xffffffffffffffff;
                  auVar57._12_4_ = 0xffffffff;
                  auVar57 = auVar57 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var12)(&args);
                  }
                  auVar41._0_4_ = -(uint)(local_b48._0_4_ == 0);
                  auVar41._4_4_ = -(uint)(local_b48._4_4_ == 0);
                  auVar41._8_4_ = -(uint)(local_b48._8_4_ == 0);
                  auVar41._12_4_ = -(uint)(local_b48._12_4_ == 0);
                  auVar57 = auVar41 ^ _DAT_01f7ae20;
                  auVar129 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar41)
                  ;
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar129;
                }
                if ((_DAT_01f7bb20 & auVar57) != (undefined1  [16])0x0) goto LAB_0027153a;
                *(float *)(ray + k * 4 + 0x80) = fVar95;
                pSVar32 = scene;
              }
              uVar33 = uVar33 ^ 1L << (uVar34 & 0x3f);
            } while (uVar33 != 0);
            fStack_a8c = *(float *)(ray + k * 4 + 0x10);
            fStack_aa4 = *(float *)(ray + k * 4 + 0x20);
            fVar83 = *(float *)(ray + k * 4 + 0x40);
            uVar6 = *(undefined4 *)(ray + k * 4 + 0x50);
            auVar129._4_4_ = uVar6;
            auVar129._0_4_ = uVar6;
            auVar129._8_4_ = uVar6;
            auVar129._12_4_ = uVar6;
            fVar84 = *(float *)(ray + k * 4 + 0x60);
            pRVar27 = ray;
            fVar80 = *(float *)(ray + k * 4);
          }
        }
        fStack_b2c = fVar80;
        fVar125 = auVar102._4_4_;
        fVar130 = auVar102._0_4_;
        fVar80 = auVar102._8_4_;
        fVar53 = local_b38 - fVar53;
        fVar63 = fVar94 - fVar63;
        fStack_a70 = (float)local_7e8 - fStack_a70;
        fStack_a6c = fVar130 - fStack_a6c;
        local_b28._0_4_ = fStack_b34 - (float)local_b28;
        local_b28._4_4_ = fVar123 - local_b28._4_4_;
        fStack_b20 = local_7e8._4_4_ - fStack_b20;
        fStack_b1c = fVar125 - fStack_b1c;
        fVar134 = fStack_b30 - fVar134;
        fVar136 = fVar124 - fVar136;
        fVar43 = (float)uStack_7e0 - fVar43;
        fVar70 = fVar80 - fVar70;
        fVar127 = fVar127 - local_b38;
        fVar131 = fVar131 - fVar94;
        fVar105 = fStack_a30 - (float)local_7e8;
        fVar106 = fStack_a2c - fVar130;
        fVar54 = fVar54 - fStack_b34;
        fVar64 = fVar64 - fVar123;
        fVar69 = fVar69 - local_7e8._4_4_;
        fVar59 = fVar59 - fVar125;
        fVar107 = fVar107 - fStack_b30;
        fVar110 = fVar110 - fVar124;
        fVar38 = fVar38 - (float)uStack_7e0;
        fVar65 = fVar65 - fVar80;
        local_958[0] = fVar54 * fVar134 - fVar107 * (float)local_b28;
        local_958[1] = fVar64 * fVar136 - fVar110 * local_b28._4_4_;
        local_958[2] = fVar69 * fVar43 - fVar38 * fStack_b20;
        local_958[3] = fVar59 * fVar70 - fVar65 * fStack_b1c;
        local_948[0] = fVar107 * fVar53 - fVar127 * fVar134;
        local_948[1] = fVar110 * fVar63 - fVar131 * fVar136;
        local_948[2] = fVar38 * fStack_a70 - fVar105 * fVar43;
        local_948[3] = fVar65 * fStack_a6c - fVar106 * fVar70;
        local_938[0] = fVar127 * (float)local_b28 - fVar54 * fVar53;
        local_938[1] = fVar131 * local_b28._4_4_ - fVar64 * fVar63;
        local_938[2] = fVar105 * fStack_b20 - fVar69 * fStack_a70;
        local_938[3] = fVar106 * fStack_b1c - fVar59 * fStack_a6c;
        fVar100 = local_b38 - fStack_b2c;
        fVar94 = fVar94 - fStack_b2c;
        fVar103 = (float)local_7e8 - fStack_b2c;
        fVar130 = fVar130 - fStack_b2c;
        fVar68 = fStack_b34 - fStack_a8c;
        fVar123 = fVar123 - fStack_a8c;
        fVar73 = local_7e8._4_4_ - fStack_a8c;
        fVar125 = fVar125 - fStack_a8c;
        local_b38 = fStack_b30 - fStack_aa4;
        fStack_b34 = fVar124 - fStack_aa4;
        fStack_b30 = (float)uStack_7e0 - fStack_aa4;
        fStack_b2c = fVar80 - fStack_aa4;
        fVar80 = auVar129._0_4_;
        fVar126 = auVar129._4_4_;
        fVar95 = auVar129._8_4_;
        fVar124 = auVar129._12_4_;
        fVar98 = fVar68 * fVar84 - local_b38 * fVar80;
        fVar132 = fVar123 * fVar84 - fStack_b34 * fVar126;
        fVar99 = fVar73 * fVar84 - fStack_b30 * fVar95;
        fVar45 = fVar125 * fVar84 - fStack_b2c * fVar124;
        fVar47 = local_b38 * fVar83 - fVar100 * fVar84;
        fVar49 = fStack_b34 * fVar83 - fVar94 * fVar84;
        fVar52 = fStack_b30 * fVar83 - fVar103 * fVar84;
        fVar62 = fStack_b2c * fVar83 - fVar130 * fVar84;
        fVar90 = fVar100 * fVar80 - fVar68 * fVar83;
        fVar91 = fVar94 * fVar126 - fVar123 * fVar83;
        fVar92 = fVar103 * fVar95 - fVar73 * fVar83;
        fVar93 = fVar130 * fVar124 - fVar125 * fVar83;
        fVar85 = fVar83 * local_958[0] + fVar80 * local_948[0] + fVar84 * local_938[0];
        fVar88 = fVar83 * local_958[1] + fVar126 * local_948[1] + fVar84 * local_938[1];
        fVar89 = fVar83 * local_958[2] + fVar95 * local_948[2] + fVar84 * local_938[2];
        fVar124 = fVar83 * local_958[3] + fVar124 * local_948[3] + fVar84 * local_938[3];
        uVar39 = (uint)fVar85 & 0x80000000;
        uVar44 = (uint)fVar88 & 0x80000000;
        uVar46 = (uint)fVar89 & 0x80000000;
        uVar48 = (uint)fVar124 & 0x80000000;
        fVar104 = (float)((uint)(fVar127 * fVar98 + fVar54 * fVar47 + fVar107 * fVar90) ^ uVar39);
        fVar131 = (float)((uint)(fVar131 * fVar132 + fVar64 * fVar49 + fVar110 * fVar91) ^ uVar44);
        fVar64 = (float)((uint)(fVar105 * fVar99 + fVar69 * fVar52 + fVar38 * fVar92) ^ uVar46);
        fVar110 = (float)((uint)(fVar106 * fVar45 + fVar59 * fVar62 + fVar65 * fVar93) ^ uVar48);
        fVar80 = (float)((uint)(fVar98 * fVar53 + fVar47 * (float)local_b28 + fVar90 * fVar134) ^
                        uVar39);
        fVar83 = (float)((uint)(fVar132 * fVar63 + fVar49 * local_b28._4_4_ + fVar91 * fVar136) ^
                        uVar44);
        fVar84 = (float)((uint)(fVar99 * fStack_a70 + fVar52 * fStack_b20 + fVar92 * fVar43) ^
                        uVar46);
        fVar126 = (float)((uint)(fVar45 * fStack_a6c + fVar62 * fStack_b1c + fVar93 * fVar70) ^
                         uVar48);
        fVar95 = ABS(fVar85);
        fVar127 = ABS(fVar88);
        fVar54 = ABS(fVar89);
        fVar107 = ABS(fVar124);
        bVar21 = ((0.0 <= fVar80 && 0.0 <= fVar104) && fVar85 != 0.0) && fVar104 + fVar80 <= fVar95;
        auVar40._0_4_ = -(uint)bVar21;
        bVar23 = ((0.0 <= fVar83 && 0.0 <= fVar131) && fVar88 != 0.0) && fVar131 + fVar83 <= fVar127
        ;
        auVar40._4_4_ = -(uint)bVar23;
        bVar22 = ((0.0 <= fVar84 && 0.0 <= fVar64) && fVar89 != 0.0) && fVar64 + fVar84 <= fVar54;
        auVar40._8_4_ = -(uint)bVar22;
        bVar20 = ((0.0 <= fVar126 && 0.0 <= fVar110) && fVar124 != 0.0) &&
                 fVar110 + fVar126 <= fVar107;
        auVar40._12_4_ = -(uint)bVar20;
        iVar25 = movmskps((int)pRVar27,auVar40);
        uVar33 = local_af0;
        if (iVar25 != 0) {
          fVar53 = (float)(uVar39 ^ (uint)(fVar100 * local_958[0] +
                                          fVar68 * local_948[0] + local_b38 * local_938[0]));
          fVar123 = (float)(uVar44 ^ (uint)(fVar94 * local_958[1] +
                                           fVar123 * local_948[1] + fStack_b34 * local_938[1]));
          fVar134 = (float)(uVar46 ^ (uint)(fVar103 * local_958[2] +
                                           fVar73 * local_948[2] + fStack_b30 * local_938[2]));
          fVar124 = (float)(uVar48 ^ (uint)(fVar130 * local_958[3] +
                                           fVar125 * local_948[3] + fStack_b2c * local_938[3]));
          fVar94 = *(float *)(ray + k * 4 + 0x30);
          bVar14 = fVar94 * fVar95 < fVar53;
          bVar15 = fVar94 * fVar127 < fVar123;
          bVar16 = fVar94 * fVar54 < fVar134;
          bVar17 = fVar94 * fVar107 < fVar124;
          auVar101._4_4_ = -(uint)bVar15;
          auVar101._0_4_ = -(uint)bVar14;
          auVar101._8_4_ = -(uint)bVar16;
          auVar101._12_4_ = -(uint)bVar17;
          fVar94 = *(float *)(ray + k * 4 + 0x80);
          auVar96._0_4_ = -(uint)((fVar53 <= fVar94 * fVar95 && bVar14) && bVar21);
          auVar96._4_4_ = -(uint)((fVar123 <= fVar94 * fVar127 && bVar15) && bVar23);
          auVar96._8_4_ = -(uint)((fVar134 <= fVar94 * fVar54 && bVar16) && bVar22);
          auVar96._12_4_ = -(uint)((fVar124 <= fVar94 * fVar107 && bVar17) && bVar20);
          uVar39 = movmskps((int)ray,auVar96);
          pauVar30 = (undefined1 (*) [16])k;
          if (uVar39 != 0) {
            local_928 = local_888;
            pSVar32 = context->scene;
            auVar18._4_4_ = fVar127;
            auVar18._0_4_ = fVar95;
            auVar18._8_4_ = fVar54;
            auVar18._12_4_ = fVar107;
            auVar102 = rcpps(auVar101,auVar18);
            fVar130 = auVar102._0_4_;
            fVar98 = auVar102._4_4_;
            fVar136 = auVar102._8_4_;
            fVar125 = auVar102._12_4_;
            fVar132 = (float)DAT_01f7ba10;
            fVar99 = DAT_01f7ba10._4_4_;
            fVar69 = DAT_01f7ba10._12_4_;
            fVar63 = DAT_01f7ba10._8_4_;
            fVar130 = (fVar132 - fVar95 * fVar130) * fVar130 + fVar130;
            fVar98 = (fVar99 - fVar127 * fVar98) * fVar98 + fVar98;
            fVar136 = (fVar63 - fVar54 * fVar136) * fVar136 + fVar136;
            fVar125 = (fVar69 - fVar107 * fVar125) * fVar125 + fVar125;
            local_968[0] = fVar53 * fVar130;
            local_968[1] = fVar123 * fVar98;
            local_968[2] = fVar134 * fVar136;
            local_968[3] = fVar124 * fVar125;
            auVar128._0_4_ = fVar104 * fVar130;
            auVar128._4_4_ = fVar131 * fVar98;
            auVar128._8_4_ = fVar64 * fVar136;
            auVar128._12_4_ = fVar110 * fVar125;
            auVar129 = minps(auVar128,_DAT_01f7ba10);
            auVar97._0_4_ = fVar130 * fVar80;
            auVar97._4_4_ = fVar98 * fVar83;
            auVar97._8_4_ = fVar136 * fVar84;
            auVar97._12_4_ = fVar125 * fVar126;
            auVar102 = minps(auVar97,_DAT_01f7ba10);
            auVar76._0_4_ = fVar132 - auVar129._0_4_;
            auVar76._4_4_ = fVar99 - auVar129._4_4_;
            auVar76._8_4_ = fVar63 - auVar129._8_4_;
            auVar76._12_4_ = fVar69 - auVar129._12_4_;
            auVar82._0_4_ = fVar132 - auVar102._0_4_;
            auVar82._4_4_ = fVar99 - auVar102._4_4_;
            auVar82._8_4_ = fVar63 - auVar102._8_4_;
            auVar82._12_4_ = fVar69 - auVar102._12_4_;
            local_988 = blendvps(auVar129,auVar76,local_888);
            local_978 = blendvps(auVar102,auVar82,local_888);
            uVar34 = (ulong)(uVar39 & 0xff);
            do {
              uVar13 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              local_8b8 = local_af8[uVar13];
              pauVar30 = (undefined1 (*) [16])(ulong)local_8b8;
              local_b28 = (pSVar32->geometries).items[(long)pauVar30].ptr;
              if ((local_b28->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (local_b28->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0027153a:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar24;
                }
                local_8e8 = *(undefined4 *)(local_988 + uVar13 * 4);
                fVar80 = local_968[uVar13 - 4];
                *(float *)(ray + k * 4 + 0x80) = local_968[uVar13];
                args.context = context->user;
                uVar6 = *(undefined4 *)(local_b08 + 0x50 + uVar13 * 4);
                local_8c8._4_4_ = uVar6;
                local_8c8._0_4_ = uVar6;
                local_8c8._8_4_ = uVar6;
                local_8c8._12_4_ = uVar6;
                local_8d8._4_4_ = fVar80;
                local_8d8._0_4_ = fVar80;
                local_8d8._8_4_ = fVar80;
                local_8d8._12_4_ = fVar80;
                local_918 = local_958[uVar13];
                local_908._4_4_ = local_948[uVar13];
                local_8f8 = local_938[uVar13];
                fStack_914 = local_918;
                fStack_910 = local_918;
                fStack_90c = local_918;
                local_908._0_4_ = local_908._4_4_;
                fStack_900 = (float)local_908._4_4_;
                fStack_8fc = (float)local_908._4_4_;
                fStack_8f4 = local_8f8;
                fStack_8f0 = local_8f8;
                fStack_8ec = local_8f8;
                uStack_8e4 = local_8e8;
                uStack_8e0 = local_8e8;
                uStack_8dc = local_8e8;
                uStack_8b4 = local_8b8;
                uStack_8b0 = local_8b8;
                uStack_8ac = local_8b8;
                local_8a8 = (args.context)->instID[0];
                uStack_8a4 = local_8a8;
                uStack_8a0 = local_8a8;
                uStack_89c = local_8a8;
                local_898 = (args.context)->instPrimID[0];
                uStack_894 = local_898;
                uStack_890 = local_898;
                uStack_88c = local_898;
                local_b48 = *local_b10;
                args.valid = (int *)local_b48;
                args.geometryUserPtr = local_b28->userPtr;
                args.hit = (RTCHitN *)&local_918;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (local_b28->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*local_b28->occlusionFilterN)(&args);
                }
                if (local_b48 == (undefined1  [16])0x0) {
                  auVar58._8_4_ = 0xffffffff;
                  auVar58._0_8_ = 0xffffffffffffffff;
                  auVar58._12_4_ = 0xffffffff;
                  auVar58 = auVar58 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_b28->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var12)(&args);
                  }
                  auVar42._0_4_ = -(uint)(local_b48._0_4_ == 0);
                  auVar42._4_4_ = -(uint)(local_b48._4_4_ == 0);
                  auVar42._8_4_ = -(uint)(local_b48._8_4_ == 0);
                  auVar42._12_4_ = -(uint)(local_b48._12_4_ == 0);
                  auVar58 = auVar42 ^ _DAT_01f7ae20;
                  auVar102 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar42)
                  ;
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar102;
                }
                if ((_DAT_01f7bb20 & auVar58) != (undefined1  [16])0x0) goto LAB_0027153a;
                *(float *)(ray + k * 4 + 0x80) = fVar94;
                pauVar30 = (undefined1 (*) [16])k;
                uVar33 = local_af0;
                fStack_a30 = 0.0;
                fStack_a2c = 0.0;
              }
              uVar34 = uVar34 ^ 1L << (uVar13 & 0x3f);
            } while (uVar34 != 0);
          }
        }
        lVar28 = lVar28 + 1;
        fVar83 = local_808;
        fVar95 = fStack_804;
        fVar127 = fStack_800;
        fVar54 = fStack_7fc;
        fVar84 = local_828;
        fVar107 = fStack_824;
        fVar53 = fStack_820;
        fVar134 = fStack_81c;
        iVar25 = local_858;
        iVar108 = iStack_854;
        iVar111 = iStack_850;
        iVar113 = iStack_84c;
        iVar115 = local_868;
        iVar117 = iStack_864;
        iVar119 = iStack_860;
        iVar121 = iStack_85c;
        fVar80 = local_7f8;
        fVar124 = fStack_7f4;
        fVar130 = fStack_7f0;
        fVar98 = fStack_7ec;
        fVar94 = local_818;
        fVar131 = fStack_814;
        fVar64 = fStack_810;
        fVar110 = fStack_80c;
        fVar123 = local_838;
        fVar63 = fStack_834;
        fVar136 = fStack_830;
        fVar125 = fStack_82c;
        fVar126 = local_848;
        fVar132 = fStack_844;
        fVar99 = fStack_840;
        fVar69 = fStack_83c;
      } while (lVar28 != uVar26 - 8);
    }
joined_r0x002706e8:
    bVar24 = local_b50 != stack;
    if (!bVar24) {
      return bVar24;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }